

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.cc
# Opt level: O0

int ERR_pop_to_mark(void)

{
  ERR_STATE *pEVar1;
  err_error_st *error_00;
  err_error_st *error;
  ERR_STATE *state;
  
  pEVar1 = err_get_state();
  if (pEVar1 != (ERR_STATE *)0x0) {
    while (pEVar1->bottom != pEVar1->top) {
      error_00 = pEVar1->errors + pEVar1->top;
      if ((error_00->field_0x16 & 1) != 0) {
        error_00->field_0x16 = error_00->field_0x16 & 0xfe;
        return 1;
      }
      err_clear(error_00);
      if (pEVar1->top == 0) {
        pEVar1->top = 0xf;
      }
      else {
        pEVar1->top = pEVar1->top - 1;
      }
    }
  }
  return 0;
}

Assistant:

int ERR_pop_to_mark(void) {
  ERR_STATE *const state = err_get_state();

  if (state == NULL) {
    return 0;
  }

  while (state->bottom != state->top) {
    struct err_error_st *error = &state->errors[state->top];

    if (error->mark) {
      error->mark = 0;
      return 1;
    }

    err_clear(error);
    if (state->top == 0) {
      state->top = ERR_NUM_ERRORS - 1;
    } else {
      state->top--;
    }
  }

  return 0;
}